

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O3

void disas_simd_across_lanes(DisasContext_conflict1 *s,uint32_t insn)

{
  TCGContext_conflict1 *s_00;
  bool bVar1;
  uint uVar2;
  MemOp MVar3;
  TCGTemp *a1;
  TCGTemp *a3;
  TCGv_ptr fpst;
  TCGv_i32 arg;
  uint srcidx;
  TCGv_i64 tcg_dest;
  uint size;
  uint uVar4;
  int line;
  uint uVar5;
  MemOp memop;
  uintptr_t o;
  uint uVar6;
  uintptr_t o_2;
  TCGv_i64 tcg_dest_00;
  uint element;
  uintptr_t o_1;
  
  uVar6 = insn >> 0xc & 0x1f;
  if (0x1b < (ushort)uVar6) goto LAB_006a8708;
  s_00 = s->uc->tcg_ctx;
  uVar2 = insn & 0x20000000;
  if ((0x4000408U >> uVar6 & 1) == 0) {
    if ((0x9000U >> uVar6 & 1) != 0) {
      uVar5 = insn >> 0x17 & 1;
      if (uVar2 == 0) {
        if ((s->isar->id_aa64pfr0 & 0xf0000) != 0x10000) goto LAB_006a8708;
        MVar3 = MO_16;
      }
      else {
        if ((insn & 0x40400000) != 0x40000000) goto LAB_006a8708;
        MVar3 = MO_32;
      }
      bVar1 = true;
      goto LAB_006a86ca;
    }
    if ((uVar6 != 0x1b) || (uVar2 != 0)) goto LAB_006a8708;
  }
  MVar3 = insn >> 0x16 & MO_64;
  if (MVar3 == MO_64) {
LAB_006a8708:
    unallocated_encoding_aarch64(s);
    return;
  }
  if (MVar3 == MO_32) {
    if ((insn >> 0x1e & 1) == 0) goto LAB_006a8708;
    MVar3 = MO_32;
  }
  uVar5 = 0;
  bVar1 = false;
LAB_006a86ca:
  if (s->fp_access_checked == true) {
    __assert_fail("!s->fp_access_checked",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                  ,0x487,"_Bool fp_access_check(DisasContext *)");
  }
  s->fp_access_checked = true;
  if (s->fp_excp_el != 0) {
    gen_exception_insn(s,s->pc_curr,1,0x1fe0000a,s->fp_excp_el);
    return;
  }
  srcidx = insn >> 5 & 0x1f;
  size = (insn >> 0x18 & 0x40) + 0x40;
  uVar4 = size >> (sbyte)MVar3 + 3;
  element = 1;
  a1 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
  tcg_dest = (TCGv_i64)((long)a1 - (long)s_00);
  a3 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
  tcg_dest_00 = (TCGv_i64)((long)a3 - (long)s_00);
  if (bVar1) {
    fpst = get_fpstatus_ptr_aarch64(s_00,MVar3 == MO_16);
    arg = do_reduction_op(s,uVar2 >> 0x18 | uVar6 | uVar5 << 4,srcidx,8 << (sbyte)MVar3,size,
                          ~(-1 << ((byte)uVar4 & 0x1f)),fpst);
    tcg_gen_extu_i32_i64_aarch64(s_00,tcg_dest,arg);
    tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(arg + (long)s_00));
    tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(fpst + (long)s_00));
  }
  else {
    memop = (uVar2 >> 0x1b | MVar3) ^ MO_ASHIFT;
    read_vec_element((DisasContext_conflict1 *)s->uc->tcg_ctx,tcg_dest,srcidx,0,memop);
    do {
      read_vec_element((DisasContext_conflict1 *)s->uc->tcg_ctx,tcg_dest_00,srcidx,element,memop);
      if (uVar6 < 0x1a) {
        if (uVar6 == 3) {
LAB_006a892f:
          tcg_gen_op3_aarch64(s_00,INDEX_op_add_i64,(TCGArg)a1,(TCGArg)a1,(TCGArg)a3);
        }
        else {
          if (uVar6 != 10) {
LAB_006a89f3:
            line = 0x1d9a;
            goto LAB_006a89ff;
          }
          if (uVar2 == 0) {
            tcg_gen_smax_i64_aarch64(s_00,tcg_dest,tcg_dest,tcg_dest_00);
          }
          else {
            tcg_gen_umax_i64_aarch64(s_00,tcg_dest,tcg_dest,tcg_dest_00);
          }
        }
      }
      else {
        if (uVar6 != 0x1a) {
          if (uVar6 != 0x1b) goto LAB_006a89f3;
          goto LAB_006a892f;
        }
        if (uVar2 == 0) {
          tcg_gen_smin_i64_aarch64(s_00,tcg_dest,tcg_dest,tcg_dest_00);
        }
        else {
          tcg_gen_umin_i64_aarch64(s_00,tcg_dest,tcg_dest,tcg_dest_00);
        }
      }
      element = element + 1;
    } while (uVar4 != element);
  }
  tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(tcg_dest_00 + (long)s_00));
  uVar6 = MVar3 + (uVar6 == 3);
  if (uVar6 < 4) {
    switch(uVar6) {
    case 0:
      tcg_gen_ext8u_i64_aarch64(s_00,tcg_dest,tcg_dest);
      break;
    case 1:
      tcg_gen_ext16u_i64_aarch64(s_00,tcg_dest,tcg_dest);
      break;
    case 2:
      tcg_gen_ext32u_i64_aarch64(s_00,tcg_dest,tcg_dest);
    }
    write_fp_dreg_aarch64(s,insn & 0x1f,tcg_dest);
    tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(tcg_dest + (long)s_00));
    return;
  }
  line = 0x1dc3;
LAB_006a89ff:
  g_assertion_message_expr
            ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
             ,line,(char *)0x0);
}

Assistant:

static void disas_simd_across_lanes(DisasContext *s, uint32_t insn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int rd = extract32(insn, 0, 5);
    int rn = extract32(insn, 5, 5);
    int size = extract32(insn, 22, 2);
    int opcode = extract32(insn, 12, 5);
    bool is_q = extract32(insn, 30, 1);
    bool is_u = extract32(insn, 29, 1);
    bool is_fp = false;
    bool is_min = false;
    int esize;
    int elements;
    int i;
    TCGv_i64 tcg_res, tcg_elt;

    switch (opcode) {
    case 0x1b: /* ADDV */
        if (is_u) {
            unallocated_encoding(s);
            return;
        }
        /* fall through */
    case 0x3: /* SADDLV, UADDLV */
    case 0xa: /* SMAXV, UMAXV */
    case 0x1a: /* SMINV, UMINV */
        if (size == 3 || (size == 2 && !is_q)) {
            unallocated_encoding(s);
            return;
        }
        break;
    case 0xc: /* FMAXNMV, FMINNMV */
    case 0xf: /* FMAXV, FMINV */
        /* Bit 1 of size field encodes min vs max and the actual size
         * depends on the encoding of the U bit. If not set (and FP16
         * enabled) then we do half-precision float instead of single
         * precision.
         */
        is_min = extract32(size, 1, 1);
        is_fp = true;
        if (!is_u && dc_isar_feature(aa64_fp16, s)) {
            size = 1;
        } else if (!is_u || !is_q || extract32(size, 0, 1)) {
            unallocated_encoding(s);
            return;
        } else {
            size = 2;
        }
        break;
    default:
        unallocated_encoding(s);
        return;
    }

    if (!fp_access_check(s)) {
        return;
    }

    esize = 8 << size;
    elements = (is_q ? 128 : 64) / esize;

    tcg_res = tcg_temp_new_i64(tcg_ctx);
    tcg_elt = tcg_temp_new_i64(tcg_ctx);

    /* These instructions operate across all lanes of a vector
     * to produce a single result. We can guarantee that a 64
     * bit intermediate is sufficient:
     *  + for [US]ADDLV the maximum element size is 32 bits, and
     *    the result type is 64 bits
     *  + for FMAX*V, FMIN*V, ADDV the intermediate type is the
     *    same as the element size, which is 32 bits at most
     * For the integer operations we can choose to work at 64
     * or 32 bits and truncate at the end; for simplicity
     * we use 64 bits always. The floating point
     * ops do require 32 bit intermediates, though.
     */
    if (!is_fp) {
        read_vec_element(s, tcg_res, rn, 0, size | (is_u ? 0 : MO_SIGN));

        for (i = 1; i < elements; i++) {
            read_vec_element(s, tcg_elt, rn, i, size | (is_u ? 0 : MO_SIGN));

            switch (opcode) {
            case 0x03: /* SADDLV / UADDLV */
            case 0x1b: /* ADDV */
                tcg_gen_add_i64(tcg_ctx, tcg_res, tcg_res, tcg_elt);
                break;
            case 0x0a: /* SMAXV / UMAXV */
                if (is_u) {
                    tcg_gen_umax_i64(tcg_ctx, tcg_res, tcg_res, tcg_elt);
                } else {
                    tcg_gen_smax_i64(tcg_ctx, tcg_res, tcg_res, tcg_elt);
                }
                break;
            case 0x1a: /* SMINV / UMINV */
                if (is_u) {
                    tcg_gen_umin_i64(tcg_ctx, tcg_res, tcg_res, tcg_elt);
                } else {
                    tcg_gen_smin_i64(tcg_ctx, tcg_res, tcg_res, tcg_elt);
                }
                break;
            default:
                g_assert_not_reached();
            }

        }
    } else {
        /* Floating point vector reduction ops which work across 32
         * bit (single) or 16 bit (half-precision) intermediates.
         * Note that correct NaN propagation requires that we do these
         * operations in exactly the order specified by the pseudocode.
         */
        TCGv_ptr fpst = get_fpstatus_ptr(tcg_ctx, size == MO_16);
        int fpopcode = opcode | is_min << 4 | is_u << 5;
        int vmap = (1 << elements) - 1;
        TCGv_i32 tcg_res32 = do_reduction_op(s, fpopcode, rn, esize,
                                             (is_q ? 128 : 64), vmap, fpst);
        tcg_gen_extu_i32_i64(tcg_ctx, tcg_res, tcg_res32);
        tcg_temp_free_i32(tcg_ctx, tcg_res32);
        tcg_temp_free_ptr(tcg_ctx, fpst);
    }

    tcg_temp_free_i64(tcg_ctx, tcg_elt);

    /* Now truncate the result to the width required for the final output */
    if (opcode == 0x03) {
        /* SADDLV, UADDLV: result is 2*esize */
        size++;
    }

    switch (size) {
    case 0:
        tcg_gen_ext8u_i64(tcg_ctx, tcg_res, tcg_res);
        break;
    case 1:
        tcg_gen_ext16u_i64(tcg_ctx, tcg_res, tcg_res);
        break;
    case 2:
        tcg_gen_ext32u_i64(tcg_ctx, tcg_res, tcg_res);
        break;
    case 3:
        break;
    default:
        g_assert_not_reached();
    }

    write_fp_dreg(s, rd, tcg_res);
    tcg_temp_free_i64(tcg_ctx, tcg_res);
}